

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Pp.cpp
# Opt level: O2

int __thiscall glslang::TPpContext::tZeroInput::scan(tZeroInput *this,TPpToken *ppToken)

{
  if ((this->super_tInput).done != false) {
    return -1;
  }
  ppToken->name[0] = '0';
  ppToken->name[1] = '\0';
  (ppToken->field_3).ival = 0;
  ppToken->space = false;
  (this->super_tInput).done = true;
  return 0x98;
}

Assistant:

int TPpContext::tZeroInput::scan(TPpToken* ppToken)
{
    if (done)
        return EndOfInput;

    ppToken->name[0] = '0';
    ppToken->name[1] = 0;
    ppToken->ival = 0;
    ppToken->space = false;
    done = true;

    return PpAtomConstInt;
}